

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O2

bool Am_Check_And_Fix_Object_Group(Am_Object *obj,Am_Object *inter,Am_Object *new_owner)

{
  bool bVar1;
  Am_Value *pAVar2;
  bool bVar3;
  Am_Object owner;
  Am_Object local_b8;
  uint local_b0;
  int local_ac;
  Am_Object *local_a8;
  Am_Object old_owner;
  Am_Value_List owner_list;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object temp;
  Am_Object curr_owner;
  Am_Object event_window;
  Am_Object local_60;
  Am_Value v;
  Am_Object local_48;
  Am_Object *local_40;
  Am_Object local_38;
  
  local_40 = new_owner;
  Am_Object::operator=(new_owner,&Am_No_Object);
  local_a8 = obj;
  Am_Object::Get_Owner((Am_Object *)&owner_list,(Am_Slot_Flags)obj);
  Am_Object::Am_Object(&local_60,&Am_Screen);
  bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&owner_list,&local_60);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object((Am_Object *)&owner_list);
  if (bVar1) {
    return true;
  }
  Am_Value_List::Am_Value_List(&owner_list);
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(inter,0x116,1);
  Am_Value::operator=(&v,pAVar2);
  bVar1 = Am_Value_List::Test(&v);
  bVar3 = true;
  if (!bVar1) goto LAB_001c2acc;
  Am_Value_List::operator=(&owner_list,&v);
  owner.data = (Am_Object_Data *)0x0;
  old_owner.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(inter,0x121,0);
  local_ac = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = Am_Object::Get(inter,0x122,0);
  local_b0 = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = Am_Object::Get(inter,0x68,0);
  Am_Object::Am_Object(&event_window,pAVar2);
  curr_owner.data = (Am_Object_Data *)0x0;
  temp.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&owner_list);
  while (bVar1 = Am_Value_List::Last(&owner_list), !bVar1) {
    pAVar2 = Am_Value_List::Get(&owner_list);
    Am_Object::operator=(&curr_owner,pAVar2);
    Am_Object::Am_Object(&local_38,&event_window);
    bVar1 = Am_Object::Is_Part_Of(&curr_owner,&local_38);
    if (bVar1) {
      bVar1 = Am_Point_In_All_Owners(&curr_owner,local_ac,local_b0,&event_window);
      Am_Object::~Am_Object(&local_38);
      if (bVar1) {
        Am_Point_In_Obj(&local_b8,(int)&curr_owner,local_ac,(Am_Object *)(ulong)local_b0);
        Am_Object::operator=(&temp,&local_b8);
        Am_Object::~Am_Object(&local_b8);
        bVar1 = Am_Object::Valid(&temp);
        if (bVar1) {
          bVar1 = Am_Object::Valid(&owner);
          if (bVar1) {
            Am_Object::Am_Object(&local_48,&owner);
            bVar1 = Am_Object::Is_Part_Of(&curr_owner,&local_48);
            Am_Object::~Am_Object(&local_48);
            if (!bVar1) goto LAB_001c29f9;
          }
          Am_Object::operator=(&owner,&curr_owner);
        }
      }
    }
    else {
      Am_Object::~Am_Object(&local_38);
    }
LAB_001c29f9:
    Am_Value_List::Next(&owner_list);
  }
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    Am_Object::operator=(local_40,&owner);
    Am_Object::Get_Owner(&local_b8,(Am_Slot_Flags)local_a8);
    Am_Object::operator=(&old_owner,&local_b8);
    Am_Object::~Am_Object(&local_b8);
    bVar1 = Am_Object::operator!=(&owner,&old_owner);
    bVar3 = true;
    if (bVar1) {
      Am_Object::Am_Object(&local_80,local_a8);
      bVar1 = Am_Object::Is_Part_Of(&owner,&local_80);
      Am_Object::~Am_Object(&local_80);
      if (bVar1) goto LAB_001c2a98;
      Am_Object::Remove_From_Owner(local_a8);
      Am_Object::Am_Object(&local_88,local_a8);
      Am_Object::Add_Part(&owner,&local_88,true,0);
      Am_Object::~Am_Object(&local_88);
    }
  }
  else {
LAB_001c2a98:
    bVar3 = false;
  }
  Am_Object::~Am_Object(&temp);
  Am_Object::~Am_Object(&curr_owner);
  Am_Object::~Am_Object(&event_window);
  Am_Object::~Am_Object(&old_owner);
  Am_Object::~Am_Object(&owner);
LAB_001c2acc:
  Am_Value::~Am_Value(&v);
  Am_Value_List::~Am_Value_List(&owner_list);
  return bVar3;
}

Assistant:

bool
Am_Check_And_Fix_Object_Group(Am_Object &obj, const Am_Object &inter,
                              Am_Object &new_owner)
{
  new_owner = Am_No_Object;
  // if we are moving a top-level window, don't need to do anything
  if (obj.Get_Owner().Is_Instance_Of(Am_Screen))
    return true;

  Am_Value_List owner_list;
  Am_Value v;
  v = inter.Peek(Am_MULTI_OWNERS);
  if (Am_Value_List::Test(v))
    owner_list = v;
  else
    return true; //otherwise, leave in original window

  Am_Object owner, old_owner;
  int x = inter.Get(Am_INTERIM_X);
  int y = inter.Get(Am_INTERIM_Y);
  Am_Object event_window = inter.Get(Am_WINDOW);

  Am_Object curr_owner, temp;
  for (owner_list.Start(); !owner_list.Last(); owner_list.Next()) {
    curr_owner = owner_list.Get();
    if (curr_owner.Is_Part_Of(event_window) &&
        Am_Point_In_All_Owners(curr_owner, x, y, event_window)) {
      temp = Am_Point_In_Obj(curr_owner, x, y, event_window);
      if (temp.Valid()) {
        if (!owner.Valid() || curr_owner.Is_Part_Of(owner))
          owner = curr_owner;
      }
    }
  }
  if (!owner.Valid())
    return false;
  new_owner = owner;
  old_owner = obj.Get_Owner();
  if (owner != old_owner) {
    if (owner.Is_Part_Of(obj))
      return false;
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "Inter " << inter << " moving object " << obj
                                  << " to new owner " << owner
                                  << " because mouse moved from prev owner "
                                  << old_owner);
    obj.Remove_From_Owner(); // make the object no longer be a part of its old
                             // place
    owner.Add_Part(obj);
  }
  return true;
}